

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Int.hpp
# Opt level: O0

uint Lib::Int::gcd<int>(int i,int j)

{
  uint b;
  uint a;
  uint local_14;
  int in_stack_fffffffffffffff0;
  uint local_4;
  
  local_4 = safeAbs(in_stack_fffffffffffffff0);
  local_14 = safeAbs(local_4);
  if ((local_4 == 0) && (local_14 == 0)) {
    local_4 = 1;
  }
  else {
    for (; local_14 != 0; local_14 = local_14 % local_4) {
      local_4 = local_4 % local_14;
      if (local_4 == 0) {
        return local_14;
      }
    }
  }
  return local_4;
}

Assistant:

static unsigned gcd(INT i,INT j)
  {
    unsigned a=safeAbs(i);
    unsigned b=safeAbs(j);

    if(!a && !b) {
      return 1; // gcd of (0,0) set arbitrarily to 1
    }

    while (b!=0) {
      a %= b;
      if(a==0) {
        return b;
      }
      b %= a;
    }
    return a;
  }